

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall Fad<long_double>::Fad(Fad<long_double> *this,int sz,int i,longdouble *x)

{
  longdouble local_28;
  
  this->val_ = *x;
  local_28 = (longdouble)0;
  Vector<long_double>::Vector(&this->dx_,sz,&local_28);
  this->defaultVal = (longdouble)0;
  (this->dx_).ptr_to_data[i] = (longdouble)1;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}